

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Iter_less_val::operator()
          (_Iter_less_val *this,pair<crnlib::vec<2U,_float>,_unsigned_int> *__it,
          pair<crnlib::vec<2U,_float>,_unsigned_int> *__val)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  
  fVar2 = (__it->first).m_s[0];
  fVar3 = (__val->first).m_s[0];
  bVar5 = fVar2 == fVar3;
  if (fVar2 < fVar3) {
    return true;
  }
  bVar6 = bVar5;
  if (bVar5) {
    fVar4 = (__it->first).m_s[1];
    bVar6 = true;
    pfVar1 = (__val->first).m_s + 1;
    if (*pfVar1 <= fVar4) {
      bVar5 = false;
      bVar6 = fVar4 == *pfVar1;
      goto LAB_0017afe1;
    }
  }
  else {
LAB_0017afe1:
    bVar6 = (bool)(bVar6 ^ 1U | fVar2 != fVar3);
  }
  if ((bVar5) && (bVar6)) {
    return true;
  }
  bVar5 = fVar3 == fVar2;
  if (fVar3 < fVar2) {
    return false;
  }
  bVar6 = bVar5;
  if (bVar5) {
    fVar4 = (__val->first).m_s[1];
    bVar6 = true;
    pfVar1 = (__it->first).m_s + 1;
    if (fVar4 < *pfVar1) goto LAB_0017b02d;
    bVar5 = false;
    bVar6 = fVar4 == *pfVar1;
  }
  bVar6 = (bool)(bVar6 ^ 1U | fVar3 != fVar2);
LAB_0017b02d:
  if ((bVar5) && (bVar6)) {
    return false;
  }
  return __it->second < __val->second;
}

Assistant:

inline bool operator<(const vec& rhs) const {
    for (uint i = 0; i < N; i++) {
      if (m_s[i] < rhs.m_s[i])
        return true;
      else if (!(m_s[i] == rhs.m_s[i]))
        return false;
    }

    return false;
  }